

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_stats_scan_avx2_256_16.c
# Opt level: O2

parasail_result_t *
parasail_nw_stats_scan_profile_avx2_256_16
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  __m256i *palVar1;
  __m256i alVar2;
  __m256i alVar3;
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  void *pvVar8;
  parasail_matrix_t *ppVar9;
  void *pvVar10;
  void *pvVar11;
  ulong uVar12;
  ulong uVar13;
  __m256i alVar14;
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  __m256i alVar19;
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  __m256i c;
  __m256i c_00;
  __m256i c_01;
  short sVar23;
  int iVar24;
  uint uVar25;
  undefined4 uVar26;
  parasail_result_t *ppVar27;
  __m256i *b;
  __m256i *b_00;
  __m256i *b_01;
  __m256i *b_02;
  __m256i *ptr;
  __m256i *b_03;
  __m256i *b_04;
  __m256i *b_05;
  __m256i *ptr_00;
  __m256i *ptr_01;
  __m256i *ptr_02;
  __m256i *ptr_03;
  __m256i *ptr_04;
  __m256i *ptr_05;
  int16_t *ptr_06;
  short sVar28;
  uint uVar29;
  size_t sVar30;
  ulong uVar31;
  char *pcVar32;
  int16_t iVar33;
  short sVar34;
  int iVar35;
  int iVar36;
  uint uVar37;
  short sVar38;
  int iVar39;
  char *__format;
  long lVar40;
  undefined2 uVar41;
  long lVar42;
  int iVar43;
  ulong size;
  bool bVar44;
  undefined2 uVar45;
  undefined2 uVar46;
  undefined2 uVar47;
  undefined1 auVar48 [16];
  undefined1 auVar53 [16];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar58 [16];
  undefined1 auVar56 [32];
  __m256i alVar57;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [32];
  undefined1 auVar62 [16];
  undefined1 auVar63 [32];
  undefined1 in_ZMM5 [64];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 in_ZMM9 [64];
  undefined1 in_ZMM15 [64];
  __m256i_16_t h;
  undefined1 in_stack_fffffffffffffd00 [24];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_1e0 [32];
  undefined1 local_160 [32];
  longlong local_80;
  longlong lStack_78;
  longlong lStack_70;
  longlong lStack_68;
  
  if (profile == (parasail_profile_t *)0x0) {
    __format = "%s: missing %s\n";
    pcVar32 = "profile";
  }
  else {
    pvVar8 = (profile->profile16).score;
    if (pvVar8 == (void *)0x0) {
      __format = "%s: missing %s\n";
      pcVar32 = "profile->profile16.score";
    }
    else {
      ppVar9 = profile->matrix;
      if (ppVar9 == (parasail_matrix_t *)0x0) {
        __format = "%s: missing %s\n";
        pcVar32 = "profile->matrix";
      }
      else {
        uVar29 = profile->s1Len;
        if ((int)uVar29 < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar32 = "profile->s1Len";
        }
        else if (s2 == (char *)0x0) {
          __format = "%s: missing %s\n";
          pcVar32 = "s2";
        }
        else if (s2Len < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar32 = "s2Len";
        }
        else if (open < 0) {
          __format = "%s: %s must be >= 0\n";
          pcVar32 = "open";
        }
        else {
          if (-1 < gap) {
            uVar37 = uVar29 - 1;
            size = (ulong)uVar29 + 0xf >> 4;
            uVar12 = uVar37 / size;
            uVar13 = (ulong)uVar37 % size;
            pvVar10 = (profile->profile16).matches;
            iVar35 = -open;
            iVar24 = ppVar9->min;
            iVar36 = -iVar24;
            if (iVar24 != iVar35 && SBORROW4(iVar24,iVar35) == iVar24 + open < 0) {
              iVar36 = open;
            }
            pvVar11 = (profile->profile16).similar;
            sVar23 = 0x7ffe - (short)ppVar9->max;
            ppVar27 = parasail_result_new_stats();
            if (ppVar27 != (parasail_result_t *)0x0) {
              ppVar27->flag = ppVar27->flag | 0x10210401;
              b = parasail_memalign___m256i(0x20,size);
              b_00 = parasail_memalign___m256i(0x20,size);
              b_01 = parasail_memalign___m256i(0x20,size);
              b_02 = parasail_memalign___m256i(0x20,size);
              ptr = parasail_memalign___m256i(0x20,size);
              b_03 = parasail_memalign___m256i(0x20,size);
              b_04 = parasail_memalign___m256i(0x20,size);
              b_05 = parasail_memalign___m256i(0x20,size);
              ptr_00 = parasail_memalign___m256i(0x20,size);
              ptr_01 = parasail_memalign___m256i(0x20,size);
              ptr_02 = parasail_memalign___m256i(0x20,size);
              ptr_03 = parasail_memalign___m256i(0x20,size);
              ptr_04 = parasail_memalign___m256i(0x20,size);
              ptr_05 = parasail_memalign___m256i(0x20,size);
              ptr_06 = parasail_memalign_int16_t(0x20,(ulong)(s2Len + 1));
              auVar55._8_8_ = 0;
              auVar55._0_8_ = b;
              auVar58._8_8_ = 0;
              auVar58._0_8_ = b_00;
              auVar55 = vpunpcklqdq_avx(auVar55,auVar58);
              auVar48._8_8_ = 0;
              auVar48._0_8_ = b_01;
              auVar53._8_8_ = 0;
              auVar53._0_8_ = b_02;
              auVar58 = vpunpcklqdq_avx(auVar48,auVar53);
              auVar48 = ZEXT116(0) * auVar58 + ZEXT116(1) * auVar55;
              auVar53 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar58;
              auVar54._8_8_ = 0;
              auVar54._0_8_ = ptr;
              auVar59._8_8_ = 0;
              auVar59._0_8_ = b_03;
              auVar55 = vpunpcklqdq_avx(auVar54,auVar59);
              auVar60._8_8_ = 0;
              auVar60._0_8_ = b_04;
              auVar62._8_8_ = 0;
              auVar62._0_8_ = b_05;
              auVar58 = vpunpcklqdq_avx(auVar60,auVar62);
              auVar55 = ZEXT116(0) * auVar58 + ZEXT116(1) * auVar55;
              auVar58 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar58;
              auVar49._0_8_ = -(ulong)(auVar48._0_8_ == 0);
              auVar49._8_8_ = -(ulong)(auVar48._8_8_ == 0);
              auVar49._16_8_ = -(ulong)(auVar53._0_8_ == 0);
              auVar49._24_8_ = -(ulong)(auVar53._8_8_ == 0);
              auVar56._0_8_ = -(ulong)(auVar55._0_8_ == 0);
              auVar56._8_8_ = -(ulong)(auVar55._8_8_ == 0);
              auVar56._16_8_ = -(ulong)(auVar58._0_8_ == 0);
              auVar56._24_8_ = -(ulong)(auVar58._8_8_ == 0);
              auVar49 = vpackssdw_avx2(auVar49,auVar56);
              if (((((ptr_04 != (__m256i *)0x0 && ptr_03 != (__m256i *)0x0) &&
                    ptr_05 != (__m256i *)0x0) &&
                   ((ptr_01 != (__m256i *)0x0 && ptr_00 != (__m256i *)0x0) &&
                   ptr_02 != (__m256i *)0x0)) && ptr_06 != (int16_t *)0x0) &&
                  ((((((((auVar49 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                        (auVar49 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       (auVar49 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      SUB321(auVar49 >> 0x7f,0) == '\0') &&
                     (auVar49 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    SUB321(auVar49 >> 0xbf,0) == '\0') &&
                   (auVar49 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar49[0x1f])) {
                iVar24 = s2Len + -1;
                uVar45 = (undefined2)open;
                uVar46 = (undefined2)gap;
                uVar47 = (undefined2)(iVar36 - 0x7fffU);
                auVar50._0_2_ = (undefined2)size;
                auVar50._2_2_ = auVar50._0_2_;
                auVar50._4_2_ = auVar50._0_2_;
                auVar50._6_2_ = auVar50._0_2_;
                auVar50._8_2_ = auVar50._0_2_;
                auVar50._10_2_ = auVar50._0_2_;
                auVar50._12_2_ = auVar50._0_2_;
                auVar50._14_2_ = auVar50._0_2_;
                auVar50._16_2_ = auVar50._0_2_;
                auVar50._18_2_ = auVar50._0_2_;
                auVar50._20_2_ = auVar50._0_2_;
                auVar50._22_2_ = auVar50._0_2_;
                auVar50._24_2_ = auVar50._0_2_;
                auVar50._26_2_ = auVar50._0_2_;
                auVar50._28_2_ = auVar50._0_2_;
                auVar50._30_2_ = auVar50._0_2_;
                auVar56 = vperm2i128_avx2(auVar50,auVar50,0x28);
                iVar43 = (int)size * gap;
                auVar51._0_2_ = (undefined2)-iVar43;
                auVar51._2_2_ = auVar51._0_2_;
                auVar51._4_2_ = auVar51._0_2_;
                auVar51._6_2_ = auVar51._0_2_;
                auVar51._8_2_ = auVar51._0_2_;
                auVar51._10_2_ = auVar51._0_2_;
                auVar51._12_2_ = auVar51._0_2_;
                auVar51._14_2_ = auVar51._0_2_;
                auVar51._16_2_ = auVar51._0_2_;
                auVar51._18_2_ = auVar51._0_2_;
                auVar51._20_2_ = auVar51._0_2_;
                auVar51._22_2_ = auVar51._0_2_;
                auVar51._24_2_ = auVar51._0_2_;
                auVar51._26_2_ = auVar51._0_2_;
                auVar51._28_2_ = auVar51._0_2_;
                auVar51._30_2_ = auVar51._0_2_;
                auVar49 = vpand_avx2(auVar51,_DAT_008a5920);
                auVar51 = ZEXT432(iVar36 - 0x7fffU & 0xffff);
                auVar49 = vpaddsw_avx2(auVar51,auVar49);
                alVar14[3] = size;
                alVar14[0] = in_stack_fffffffffffffd00._0_8_;
                alVar14[1] = in_stack_fffffffffffffd00._8_8_;
                alVar14[2] = in_stack_fffffffffffffd00._16_8_;
                parasail_memset___m256i(b_03,alVar14,size);
                alVar19[3] = size;
                alVar19[0] = in_stack_fffffffffffffd00._0_8_;
                alVar19[1] = in_stack_fffffffffffffd00._8_8_;
                alVar19[2] = in_stack_fffffffffffffd00._16_8_;
                parasail_memset___m256i(b_04,alVar19,size);
                alVar2[3] = size;
                alVar2[0] = in_stack_fffffffffffffd00._0_8_;
                alVar2[1] = in_stack_fffffffffffffd00._8_8_;
                alVar2[2] = in_stack_fffffffffffffd00._16_8_;
                parasail_memset___m256i(b_05,alVar2,size);
                alVar3[3] = size;
                alVar3[0] = in_stack_fffffffffffffd00._0_8_;
                alVar3[1] = in_stack_fffffffffffffd00._8_8_;
                alVar3[2] = in_stack_fffffffffffffd00._16_8_;
                parasail_memset___m256i(b,alVar3,size);
                c[3] = size;
                c[0] = in_stack_fffffffffffffd00._0_8_;
                c[1] = in_stack_fffffffffffffd00._8_8_;
                c[2] = in_stack_fffffffffffffd00._16_8_;
                parasail_memset___m256i(b_00,c,size);
                c_00[3] = size;
                c_00[0] = in_stack_fffffffffffffd00._0_8_;
                c_00[1] = in_stack_fffffffffffffd00._8_8_;
                c_00[2] = in_stack_fffffffffffffd00._16_8_;
                parasail_memset___m256i(b_01,c_00,size);
                c_01[3] = size;
                c_01[0] = in_stack_fffffffffffffd00._0_8_;
                c_01[1] = in_stack_fffffffffffffd00._8_8_;
                c_01[2] = in_stack_fffffffffffffd00._16_8_;
                parasail_memset___m256i(b_02,c_01,size);
                auVar15._2_2_ = uVar45;
                auVar15._0_2_ = uVar45;
                auVar15._4_2_ = uVar45;
                auVar15._6_2_ = uVar45;
                auVar15._8_2_ = uVar45;
                auVar15._10_2_ = uVar45;
                auVar15._12_2_ = uVar45;
                auVar15._14_2_ = uVar45;
                auVar15._16_2_ = uVar45;
                auVar15._18_2_ = uVar45;
                auVar15._20_2_ = uVar45;
                auVar15._22_2_ = uVar45;
                auVar15._24_2_ = uVar45;
                auVar15._26_2_ = uVar45;
                auVar15._28_2_ = uVar45;
                auVar15._30_2_ = uVar45;
                alVar19 = (__m256i)vpsubsw_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar15);
                alVar57[1]._0_2_ = 1;
                alVar57[0] = 0x1000100010001;
                alVar57[1]._2_2_ = 1;
                alVar57[1]._4_2_ = 1;
                alVar57[1]._6_2_ = 1;
                alVar57[2]._0_2_ = 1;
                alVar57[2]._2_2_ = 1;
                alVar57[2]._4_2_ = 1;
                alVar57[2]._6_2_ = 1;
                alVar57[3]._0_2_ = 1;
                alVar57[3]._2_2_ = 1;
                alVar57[3]._4_2_ = 1;
                alVar57[3]._6_2_ = 1;
                uVar25 = (int)size - 1;
                alVar14 = alVar57;
                for (uVar29 = uVar25; -1 < (int)uVar29; uVar29 = uVar29 - 1) {
                  ptr_04[uVar29] = alVar19;
                  ptr_05[uVar29] = alVar14;
                  auVar22._2_2_ = uVar46;
                  auVar22._0_2_ = uVar46;
                  auVar22._4_2_ = uVar46;
                  auVar22._6_2_ = uVar46;
                  auVar22._8_2_ = uVar46;
                  auVar22._10_2_ = uVar46;
                  auVar22._12_2_ = uVar46;
                  auVar22._14_2_ = uVar46;
                  auVar22._16_2_ = uVar46;
                  auVar22._18_2_ = uVar46;
                  auVar22._20_2_ = uVar46;
                  auVar22._22_2_ = uVar46;
                  auVar22._24_2_ = uVar46;
                  auVar22._26_2_ = uVar46;
                  auVar22._28_2_ = uVar46;
                  auVar22._30_2_ = uVar46;
                  alVar19 = (__m256i)vpsubsw_avx2((undefined1  [32])alVar19,auVar22);
                  alVar14 = (__m256i)vpaddsw_avx2((undefined1  [32])alVar14,
                                                  (undefined1  [32])alVar57);
                }
                iVar36 = iVar35;
                for (sVar30 = 0; sVar30 != size; sVar30 = sVar30 + 1) {
                  iVar39 = iVar36;
                  for (lVar40 = 0; lVar40 != 0x10; lVar40 = lVar40 + 1) {
                    uVar41 = 0x8000;
                    if (-0x8000 < iVar39) {
                      uVar41 = (undefined2)iVar39;
                    }
                    *(undefined2 *)((long)&local_80 + lVar40 * 2) = uVar41;
                    iVar39 = iVar39 - iVar43;
                  }
                  palVar1 = ptr + sVar30;
                  (*palVar1)[0] = local_80;
                  (*palVar1)[1] = lStack_78;
                  (*palVar1)[2] = lStack_70;
                  (*palVar1)[3] = lStack_68;
                  iVar36 = iVar36 - gap;
                }
                *ptr_06 = 0;
                for (uVar31 = 1; s2Len + 1 != uVar31; uVar31 = uVar31 + 1) {
                  iVar33 = -0x8000;
                  if (-0x8000 < iVar35) {
                    iVar33 = (int16_t)iVar35;
                  }
                  ptr_06[uVar31] = iVar33;
                  iVar35 = iVar35 - gap;
                }
                auVar56 = vpalignr_avx2(auVar50,auVar56,0xe);
                uVar31 = 0;
                auVar18._2_2_ = sVar23;
                auVar18._0_2_ = sVar23;
                auVar18._4_2_ = sVar23;
                auVar18._6_2_ = sVar23;
                auVar18._8_2_ = sVar23;
                auVar18._10_2_ = sVar23;
                auVar18._12_2_ = sVar23;
                auVar18._14_2_ = sVar23;
                auVar18._16_2_ = sVar23;
                auVar18._18_2_ = sVar23;
                auVar18._20_2_ = sVar23;
                auVar18._22_2_ = sVar23;
                auVar18._24_2_ = sVar23;
                auVar18._26_2_ = sVar23;
                auVar18._28_2_ = sVar23;
                auVar18._30_2_ = sVar23;
                auVar17._2_2_ = uVar47;
                auVar17._0_2_ = uVar47;
                auVar17._4_2_ = uVar47;
                auVar17._6_2_ = uVar47;
                auVar17._8_2_ = uVar47;
                auVar17._10_2_ = uVar47;
                auVar17._12_2_ = uVar47;
                auVar17._14_2_ = uVar47;
                auVar17._16_2_ = uVar47;
                auVar17._18_2_ = uVar47;
                auVar17._20_2_ = uVar47;
                auVar17._22_2_ = uVar47;
                auVar17._24_2_ = uVar47;
                auVar17._26_2_ = uVar47;
                auVar17._28_2_ = uVar47;
                auVar17._30_2_ = uVar47;
                while (uVar31 != (uint)s2Len) {
                  local_260 = in_ZMM15._0_32_;
                  alVar14 = ptr[uVar25];
                  alVar19 = b_03[uVar25];
                  alVar2 = b_04[uVar25];
                  alVar3 = b_05[uVar25];
                  auVar55 = alVar14._0_16_;
                  auVar61._0_16_ = ZEXT116(0) * auVar55 + ZEXT116(1) * auVar55;
                  auVar61._16_16_ = ZEXT116(0) * alVar14._16_16_ + ZEXT116(1) * auVar55;
                  auVar15 = vpalignr_avx2((undefined1  [32])alVar14,auVar61,0xe);
                  auVar50 = vperm2i128_avx2((undefined1  [32])alVar19,(undefined1  [32])alVar19,0x28
                                           );
                  auVar50 = vpalignr_avx2((undefined1  [32])alVar19,auVar50,0xe);
                  auVar22 = vperm2i128_avx2((undefined1  [32])alVar2,(undefined1  [32])alVar2,0x28);
                  auVar22 = vpalignr_avx2((undefined1  [32])alVar2,auVar22,0xe);
                  auVar61 = vperm2i128_avx2((undefined1  [32])alVar3,(undefined1  [32])alVar3,0x28);
                  auVar61 = vpalignr_avx2((undefined1  [32])alVar3,auVar61,0xe);
                  auVar55 = vpinsrw_avx(auVar15._0_16_,(uint)(ushort)ptr_06[uVar31],0);
                  auVar21 = vpblendd_avx2(auVar15,ZEXT1632(auVar55),0xf);
                  lVar42 = (long)(ppVar9->mapper[(byte)s2[uVar31]] * (int)size) * 0x20;
                  auVar16._2_2_ = uVar47;
                  auVar16._0_2_ = uVar47;
                  auVar16._4_2_ = uVar47;
                  auVar16._6_2_ = uVar47;
                  auVar16._8_2_ = uVar47;
                  auVar16._10_2_ = uVar47;
                  auVar16._12_2_ = uVar47;
                  auVar16._14_2_ = uVar47;
                  auVar16._16_2_ = uVar47;
                  auVar16._18_2_ = uVar47;
                  auVar16._20_2_ = uVar47;
                  auVar16._22_2_ = uVar47;
                  auVar16._24_2_ = uVar47;
                  auVar16._26_2_ = uVar47;
                  auVar16._28_2_ = uVar47;
                  auVar16._30_2_ = uVar47;
                  auVar15 = vpsubsw_avx2(auVar16,(undefined1  [32])*ptr_04);
                  local_1e0 = ZEXT1632(ZEXT816(0));
                  lVar40 = 0;
                  local_240 = ZEXT1632(ZEXT816(0));
                  local_160 = ZEXT1632(ZEXT816(0));
                  while( true ) {
                    auVar52 = in_ZMM5._0_32_;
                    auVar65 = in_ZMM9._0_32_;
                    if (size << 5 == lVar40) break;
                    auVar4 = *(undefined1 (*) [32])((long)*ptr + lVar40);
                    auVar5 = *(undefined1 (*) [32])((long)*b_03 + lVar40);
                    auVar6 = *(undefined1 (*) [32])((long)*b_04 + lVar40);
                    auVar7 = *(undefined1 (*) [32])((long)*b_05 + lVar40);
                    auVar15 = vpaddsw_avx2(auVar15,*(undefined1 (*) [32])((long)*ptr_04 + lVar40));
                    auVar63 = vpcmpgtw_avx2(auVar15,auVar16);
                    local_1e0 = vpblendvb_avx2(local_1e0,auVar52,auVar63);
                    local_240 = vpblendvb_avx2(local_240,local_260,auVar63);
                    auVar52 = vpaddsw_avx2(auVar65,*(undefined1 (*) [32])((long)*ptr_05 + lVar40));
                    local_160 = vpblendvb_avx2(local_160,auVar52,auVar63);
                    auVar65._2_2_ = uVar45;
                    auVar65._0_2_ = uVar45;
                    auVar65._4_2_ = uVar45;
                    auVar65._6_2_ = uVar45;
                    auVar65._8_2_ = uVar45;
                    auVar65._10_2_ = uVar45;
                    auVar65._12_2_ = uVar45;
                    auVar65._14_2_ = uVar45;
                    auVar65._16_2_ = uVar45;
                    auVar65._18_2_ = uVar45;
                    auVar65._20_2_ = uVar45;
                    auVar65._22_2_ = uVar45;
                    auVar65._24_2_ = uVar45;
                    auVar65._26_2_ = uVar45;
                    auVar65._28_2_ = uVar45;
                    auVar65._30_2_ = uVar45;
                    auVar64 = vpsubsw_avx2(auVar4,auVar65);
                    auVar20._2_2_ = uVar46;
                    auVar20._0_2_ = uVar46;
                    auVar20._4_2_ = uVar46;
                    auVar20._6_2_ = uVar46;
                    auVar20._8_2_ = uVar46;
                    auVar20._10_2_ = uVar46;
                    auVar20._12_2_ = uVar46;
                    auVar20._14_2_ = uVar46;
                    auVar20._16_2_ = uVar46;
                    auVar20._18_2_ = uVar46;
                    auVar20._20_2_ = uVar46;
                    auVar20._22_2_ = uVar46;
                    auVar20._24_2_ = uVar46;
                    auVar20._26_2_ = uVar46;
                    auVar20._28_2_ = uVar46;
                    auVar20._30_2_ = uVar46;
                    auVar20 = vpsubsw_avx2(*(undefined1 (*) [32])((long)*b + lVar40),auVar20);
                    auVar52 = vpcmpgtw_avx2(auVar64,auVar20);
                    auVar65 = vpblendvb_avx2(*(undefined1 (*) [32])((long)*b_00 + lVar40),auVar5,
                                             auVar52);
                    auVar63 = vpblendvb_avx2(*(undefined1 (*) [32])((long)*b_01 + lVar40),auVar6,
                                             auVar52);
                    auVar20 = vpmaxsw_avx2(auVar64,auVar20);
                    auVar64._8_2_ = 1;
                    auVar64._0_8_ = 0x1000100010001;
                    auVar64._10_2_ = 1;
                    auVar64._12_2_ = 1;
                    auVar64._14_2_ = 1;
                    auVar64._16_2_ = 1;
                    auVar64._18_2_ = 1;
                    auVar64._20_2_ = 1;
                    auVar64._22_2_ = 1;
                    auVar64._24_2_ = 1;
                    auVar64._26_2_ = 1;
                    auVar64._28_2_ = 1;
                    auVar64._30_2_ = 1;
                    auVar52 = vpblendvb_avx2(*(undefined1 (*) [32])((long)*b_02 + lVar40),auVar7,
                                             auVar52);
                    auVar61 = vpaddsw_avx2(auVar61,auVar64);
                    auVar52 = vpaddsw_avx2(auVar52,auVar64);
                    auVar21 = vpaddsw_avx2(auVar21,*(undefined1 (*) [32])
                                                    ((long)pvVar8 + lVar40 + lVar42));
                    auVar50 = vpaddsw_avx2(auVar50,*(undefined1 (*) [32])
                                                    ((long)pvVar10 + lVar40 + lVar42));
                    auVar22 = vpaddsw_avx2(auVar22,*(undefined1 (*) [32])
                                                    ((long)pvVar11 + lVar40 + lVar42));
                    auVar16 = vpmaxsw_avx2(auVar16,auVar15);
                    auVar64 = vpcmpgtw_avx2(auVar20,auVar21);
                    *(undefined1 (*) [32])((long)*b + lVar40) = auVar20;
                    *(undefined1 (*) [32])((long)*b_00 + lVar40) = auVar65;
                    auVar15 = vpblendvb_avx2(auVar50,auVar65,auVar64);
                    in_ZMM5 = ZEXT3264(auVar15);
                    *(undefined1 (*) [32])((long)*b_01 + lVar40) = auVar63;
                    local_260 = vpblendvb_avx2(auVar22,auVar63,auVar64);
                    auVar15 = vpblendvb_avx2(auVar61,auVar52,auVar64);
                    in_ZMM9 = ZEXT3264(auVar15);
                    *(undefined1 (*) [32])((long)*b_02 + lVar40) = auVar52;
                    *(undefined1 (*) [32])((long)*ptr + lVar40) = auVar21;
                    *(undefined1 (*) [32])((long)*b_03 + lVar40) = auVar50;
                    *(undefined1 (*) [32])((long)*b_04 + lVar40) = auVar22;
                    auVar15 = vpmaxsw_avx2(auVar20,auVar21);
                    *(undefined1 (*) [32])((long)*b_05 + lVar40) = auVar61;
                    lVar40 = lVar40 + 0x20;
                    auVar22 = auVar6;
                    auVar61 = auVar7;
                    auVar50 = auVar5;
                    auVar21 = auVar4;
                  }
                  auVar50 = vperm2i128_avx2(auVar52,auVar52,0x28);
                  auVar50 = vpalignr_avx2(auVar52,auVar50,0xe);
                  auVar22 = vperm2i128_avx2(local_260,local_260,0x28);
                  auVar22 = vpalignr_avx2(local_260,auVar22,0xe);
                  in_ZMM15 = ZEXT3264(auVar22);
                  auVar21 = vperm2i128_avx2(auVar65,auVar65,0x28);
                  auVar61 = vpalignr_avx2(auVar65,auVar21,0xe);
                  auVar52._0_16_ = ZEXT116(0) * auVar15._0_16_ + ZEXT116(1) * auVar21._0_16_;
                  auVar52._16_16_ = ZEXT116(0) * auVar21._16_16_ + ZEXT116(1) * auVar15._0_16_;
                  auVar15 = vpalignr_avx2(auVar15,auVar52,0xe);
                  auVar55 = vpinsrw_avx(auVar15._0_16_,(uint)(ushort)ptr_06[uVar31 + 1],0);
                  uVar31 = uVar31 + 1;
                  auVar4 = vpblendd_avx2(auVar15,ZEXT1632(auVar55),0xf);
                  auVar15 = vpaddsw_avx2(auVar4,(undefined1  [32])*ptr_04);
                  auVar52 = vpcmpgtw_avx2(auVar16,auVar15);
                  auVar65 = vpmaxsw_avx2(auVar16,auVar15);
                  auVar21 = vpblendvb_avx2(auVar50,local_1e0,auVar52);
                  auVar16 = vpblendvb_avx2(auVar22,local_240,auVar52);
                  auVar15 = vpaddsw_avx2(auVar61,(undefined1  [32])*ptr_05);
                  auVar15 = vpblendvb_avx2(auVar15,local_160,auVar52);
                  iVar36 = 0xe;
                  while( true ) {
                    auVar52 = vperm2i128_avx2(auVar65,auVar65,0x28);
                    auVar5 = vperm2i128_avx2(auVar21,auVar21,0x28);
                    auVar6 = vperm2i128_avx2(auVar16,auVar16,0x28);
                    bVar44 = iVar36 == 0;
                    iVar36 = iVar36 + -1;
                    if (bVar44) break;
                    auVar63 = vperm2i128_avx2(auVar15,auVar15,0x28);
                    auVar52 = vpalignr_avx2(auVar65,auVar52,0xe);
                    auVar52 = vpaddsw_avx2(auVar49,auVar52);
                    auVar7 = vpcmpgtw_avx2(auVar65,auVar52);
                    auVar5 = vpalignr_avx2(auVar21,auVar5,0xe);
                    auVar21 = vpblendvb_avx2(auVar5,auVar21,auVar7);
                    auVar65 = vpmaxsw_avx2(auVar65,auVar52);
                    auVar52 = vpalignr_avx2(auVar16,auVar6,0xe);
                    auVar16 = vpblendvb_avx2(auVar52,auVar16,auVar7);
                    auVar52 = vpalignr_avx2(auVar15,auVar63,0xe);
                    auVar52 = vpaddsw_avx2(auVar56,auVar52);
                    auVar15 = vpblendvb_avx2(auVar52,auVar15,auVar7);
                  }
                  auVar63 = vperm2i128_avx2(auVar15,auVar15,0x28);
                  auVar52 = vpalignr_avx2(auVar65,auVar52,0xe);
                  auVar52 = vpaddsw_avx2(auVar52,auVar51);
                  auVar7 = vpcmpgtw_avx2(auVar52,auVar4);
                  auVar21 = vpalignr_avx2(auVar21,auVar5,0xe);
                  auVar5 = vpblendvb_avx2(auVar50,auVar21,auVar7);
                  auVar4 = vpmaxsw_avx2(auVar52,auVar4);
                  auVar16 = vpalignr_avx2(auVar16,auVar6,0xe);
                  auVar65 = vpblendvb_avx2(auVar22,auVar16,auVar7);
                  auVar15 = vpalignr_avx2(auVar15,auVar63,0xe);
                  auVar22 = vpblendvb_avx2(auVar61,auVar15,auVar7);
                  for (lVar40 = 0; size << 5 != lVar40; lVar40 = lVar40 + 0x20) {
                    auVar6._2_2_ = uVar45;
                    auVar6._0_2_ = uVar45;
                    auVar6._4_2_ = uVar45;
                    auVar6._6_2_ = uVar45;
                    auVar6._8_2_ = uVar45;
                    auVar6._10_2_ = uVar45;
                    auVar6._12_2_ = uVar45;
                    auVar6._14_2_ = uVar45;
                    auVar6._16_2_ = uVar45;
                    auVar6._18_2_ = uVar45;
                    auVar6._20_2_ = uVar45;
                    auVar6._22_2_ = uVar45;
                    auVar6._24_2_ = uVar45;
                    auVar6._26_2_ = uVar45;
                    auVar6._28_2_ = uVar45;
                    auVar6._30_2_ = uVar45;
                    auVar4 = vpsubsw_avx2(auVar4,auVar6);
                    auVar7._2_2_ = uVar46;
                    auVar7._0_2_ = uVar46;
                    auVar7._4_2_ = uVar46;
                    auVar7._6_2_ = uVar46;
                    auVar7._8_2_ = uVar46;
                    auVar7._10_2_ = uVar46;
                    auVar7._12_2_ = uVar46;
                    auVar7._14_2_ = uVar46;
                    auVar7._16_2_ = uVar46;
                    auVar7._18_2_ = uVar46;
                    auVar7._20_2_ = uVar46;
                    auVar7._22_2_ = uVar46;
                    auVar7._24_2_ = uVar46;
                    auVar7._26_2_ = uVar46;
                    auVar7._28_2_ = uVar46;
                    auVar7._30_2_ = uVar46;
                    auVar6 = vpsubsw_avx2(auVar52,auVar7);
                    auVar52 = vpcmpgtw_avx2(auVar4,auVar6);
                    auVar21 = vpblendvb_avx2(auVar21,auVar5,auVar52);
                    auVar16 = vpblendvb_avx2(auVar16,auVar65,auVar52);
                    auVar22 = vpblendvb_avx2(auVar15,auVar22,auVar52);
                    auVar15 = *(undefined1 (*) [32])((long)*ptr + lVar40);
                    auVar63._8_2_ = 1;
                    auVar63._0_8_ = 0x1000100010001;
                    auVar63._10_2_ = 1;
                    auVar63._12_2_ = 1;
                    auVar63._14_2_ = 1;
                    auVar63._16_2_ = 1;
                    auVar63._18_2_ = 1;
                    auVar63._20_2_ = 1;
                    auVar63._22_2_ = 1;
                    auVar63._24_2_ = 1;
                    auVar63._26_2_ = 1;
                    auVar63._28_2_ = 1;
                    auVar63._30_2_ = 1;
                    auVar52 = vpmaxsw_avx2(auVar4,auVar6);
                    auVar65 = vpmaxsw_avx2(auVar15,*(undefined1 (*) [32])((long)*b + lVar40));
                    auVar4 = vpmaxsw_avx2(auVar52,auVar65);
                    auVar7 = vpcmpgtw_avx2(auVar65,auVar52);
                    auVar65 = vpblendvb_avx2(auVar21,*(undefined1 (*) [32])((long)*b_00 + lVar40),
                                             auVar7);
                    auVar6 = vpcmpeqw_avx2(auVar4,auVar15);
                    auVar5 = vpblendvb_avx2(auVar65,*(undefined1 (*) [32])((long)*b_03 + lVar40),
                                            auVar6);
                    auVar15 = vpblendvb_avx2(auVar16,*(undefined1 (*) [32])((long)*b_01 + lVar40),
                                             auVar7);
                    auVar65 = vpblendvb_avx2(auVar15,*(undefined1 (*) [32])((long)*b_04 + lVar40),
                                             auVar6);
                    auVar15 = vpaddsw_avx2(auVar22,auVar63);
                    auVar22 = vpblendvb_avx2(auVar15,*(undefined1 (*) [32])((long)*b_02 + lVar40),
                                             auVar7);
                    auVar22 = vpblendvb_avx2(auVar22,*(undefined1 (*) [32])((long)*b_05 + lVar40),
                                             auVar6);
                    *(undefined1 (*) [32])((long)*ptr + lVar40) = auVar4;
                    *(undefined1 (*) [32])((long)*b_03 + lVar40) = auVar5;
                    *(undefined1 (*) [32])((long)*b_04 + lVar40) = auVar65;
                    *(undefined1 (*) [32])((long)*b_05 + lVar40) = auVar22;
                    auVar18 = vpminsw_avx2(auVar18,auVar4);
                    auVar17 = vpmaxsw_avx2(auVar17,auVar4);
                    auVar17 = vpmaxsw_avx2(auVar17,auVar5);
                    auVar6 = vpmaxsw_avx2(auVar22,auVar65);
                    auVar17 = vpmaxsw_avx2(auVar17,auVar6);
                  }
                  in_ZMM5 = ZEXT3264(auVar50);
                  in_ZMM9 = ZEXT3264(auVar61);
                }
                alVar14 = ptr[uVar13];
                alVar19 = b_03[uVar13];
                alVar2 = b_04[uVar13];
                alVar3 = b_05[uVar13];
                for (iVar36 = 0; iVar36 < 0xf - (int)uVar12; iVar36 = iVar36 + 1) {
                  auVar49 = vperm2i128_avx2((undefined1  [32])alVar14,(undefined1  [32])alVar14,0x28
                                           );
                  alVar14 = (__m256i)vpalignr_avx2((undefined1  [32])alVar14,auVar49,0xe);
                  auVar49 = vperm2i128_avx2((undefined1  [32])alVar19,(undefined1  [32])alVar19,0x28
                                           );
                  alVar19 = (__m256i)vpalignr_avx2((undefined1  [32])alVar19,auVar49,0xe);
                  auVar49 = vperm2i128_avx2((undefined1  [32])alVar2,(undefined1  [32])alVar2,0x28);
                  alVar2 = (__m256i)vpalignr_avx2((undefined1  [32])alVar2,auVar49,0xe);
                  auVar49 = vperm2i128_avx2((undefined1  [32])alVar3,(undefined1  [32])alVar3,0x28);
                  alVar3 = (__m256i)vpalignr_avx2((undefined1  [32])alVar3,auVar49,0xe);
                }
                auVar21._2_2_ = uVar47;
                auVar21._0_2_ = uVar47;
                auVar21._4_2_ = uVar47;
                auVar21._6_2_ = uVar47;
                auVar21._8_2_ = uVar47;
                auVar21._10_2_ = uVar47;
                auVar21._12_2_ = uVar47;
                auVar21._14_2_ = uVar47;
                auVar21._16_2_ = uVar47;
                auVar21._18_2_ = uVar47;
                auVar21._20_2_ = uVar47;
                auVar21._22_2_ = uVar47;
                auVar21._24_2_ = uVar47;
                auVar21._26_2_ = uVar47;
                auVar21._28_2_ = uVar47;
                auVar21._30_2_ = uVar47;
                auVar49 = vpcmpgtw_avx2(auVar21,auVar18);
                auVar4._2_2_ = sVar23;
                auVar4._0_2_ = sVar23;
                auVar4._4_2_ = sVar23;
                auVar4._6_2_ = sVar23;
                auVar4._8_2_ = sVar23;
                auVar4._10_2_ = sVar23;
                auVar4._12_2_ = sVar23;
                auVar4._14_2_ = sVar23;
                auVar4._16_2_ = sVar23;
                auVar4._18_2_ = sVar23;
                auVar4._20_2_ = sVar23;
                auVar4._22_2_ = sVar23;
                auVar4._24_2_ = sVar23;
                auVar4._26_2_ = sVar23;
                auVar4._28_2_ = sVar23;
                auVar4._30_2_ = sVar23;
                auVar56 = vpcmpgtw_avx2(auVar17,auVar4);
                auVar49 = vpor_avx2(auVar56,auVar49);
                if ((((((((((((((((((((((((((((((((auVar49 >> 7 & (undefined1  [32])0x1) ==
                                                  (undefined1  [32])0x0 &&
                                                 (auVar49 >> 0xf & (undefined1  [32])0x1) ==
                                                 (undefined1  [32])0x0) &&
                                                (auVar49 >> 0x17 & (undefined1  [32])0x1) ==
                                                (undefined1  [32])0x0) &&
                                               (auVar49 >> 0x1f & (undefined1  [32])0x1) ==
                                               (undefined1  [32])0x0) &&
                                              (auVar49 >> 0x27 & (undefined1  [32])0x1) ==
                                              (undefined1  [32])0x0) &&
                                             (auVar49 >> 0x2f & (undefined1  [32])0x1) ==
                                             (undefined1  [32])0x0) &&
                                            (auVar49 >> 0x37 & (undefined1  [32])0x1) ==
                                            (undefined1  [32])0x0) &&
                                           (auVar49 >> 0x3f & (undefined1  [32])0x1) ==
                                           (undefined1  [32])0x0) &&
                                          (auVar49 >> 0x47 & (undefined1  [32])0x1) ==
                                          (undefined1  [32])0x0) &&
                                         (auVar49 >> 0x4f & (undefined1  [32])0x1) ==
                                         (undefined1  [32])0x0) &&
                                        (auVar49 >> 0x57 & (undefined1  [32])0x1) ==
                                        (undefined1  [32])0x0) &&
                                       (auVar49 >> 0x5f & (undefined1  [32])0x1) ==
                                       (undefined1  [32])0x0) &&
                                      (auVar49 >> 0x67 & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0) &&
                                     (auVar49 >> 0x6f & (undefined1  [32])0x1) ==
                                     (undefined1  [32])0x0) &&
                                    (auVar49 >> 0x77 & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) && SUB321(auVar49 >> 0x7f,0) == '\0') &&
                                  (auVar49 >> 0x87 & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                  ) && (auVar49 >> 0x8f & (undefined1  [32])0x1) ==
                                       (undefined1  [32])0x0) &&
                                (auVar49 >> 0x97 & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                               && (auVar49 >> 0x9f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               ) && (auVar49 >> 0xa7 & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) &&
                             (auVar49 >> 0xaf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar49 >> 0xb7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           SUB321(auVar49 >> 0xbf,0) == '\0') &&
                          (auVar49 >> 199 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         (auVar49 >> 0xcf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar49 >> 0xd7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       (auVar49 >> 0xdf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar49 >> 0xe7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     (auVar49 >> 0xef & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar49 >> 0xf7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    -1 < auVar49[0x1f]) {
                  uVar26 = vpextrw_avx(alVar14._16_16_,7);
                  sVar23 = (short)uVar26;
                  uVar26 = vpextrw_avx(alVar19._16_16_,7);
                  sVar28 = (short)uVar26;
                  uVar26 = vpextrw_avx(alVar2._16_16_,7);
                  sVar34 = (short)uVar26;
                  uVar26 = vpextrw_avx(alVar3._16_16_,7);
                  sVar38 = (short)uVar26;
                }
                else {
                  *(byte *)&ppVar27->flag = (byte)ppVar27->flag | 0x40;
                  sVar23 = 0;
                  sVar28 = 0;
                  sVar34 = 0;
                  sVar38 = 0;
                  iVar24 = 0;
                  uVar37 = 0;
                }
                ppVar27->score = (int)sVar23;
                ppVar27->end_query = uVar37;
                ppVar27->end_ref = iVar24;
                *(int *)(ppVar27->field_4).extra = (int)sVar28;
                ((ppVar27->field_4).stats)->similar = (int)sVar34;
                ((ppVar27->field_4).stats)->length = (int)sVar38;
                parasail_free(ptr_06);
                parasail_free(ptr_05);
                parasail_free(ptr_04);
                parasail_free(ptr_03);
                parasail_free(ptr_02);
                parasail_free(ptr_01);
                parasail_free(ptr_00);
                parasail_free(b_05);
                parasail_free(b_04);
                parasail_free(b_03);
                parasail_free(ptr);
                parasail_free(b_02);
                parasail_free(b_01);
                parasail_free(b_00);
                parasail_free(b);
                return ppVar27;
              }
            }
            return (parasail_result_t *)0x0;
          }
          __format = "%s: %s must be >= 0\n";
          pcVar32 = "gap";
        }
      }
    }
  }
  fprintf(_stderr,__format,"parasail_nw_stats_scan_profile_avx2_256_16",pcVar32);
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m256i* restrict pvP = NULL;
    __m256i* restrict pvPm = NULL;
    __m256i* restrict pvPs = NULL;
    __m256i* restrict pvE = NULL;
    __m256i* restrict pvEM = NULL;
    __m256i* restrict pvES = NULL;
    __m256i* restrict pvEL = NULL;
    __m256i* restrict pvH = NULL;
    __m256i* restrict pvHM = NULL;
    __m256i* restrict pvHS = NULL;
    __m256i* restrict pvHL = NULL;
    __m256i* restrict pvHMax = NULL;
    __m256i* restrict pvHMMax = NULL;
    __m256i* restrict pvHSMax = NULL;
    __m256i* restrict pvHLMax = NULL;
    __m256i* restrict pvGapper = NULL;
    __m256i* restrict pvGapperL = NULL;
    int16_t* restrict boundary = NULL;
    __m256i vGapO;
    __m256i vGapE;
    int16_t NEG_LIMIT = 0;
    int16_t POS_LIMIT = 0;
    __m256i vZero;
    __m256i vOne;
    int16_t score = 0;
    int16_t matches = 0;
    int16_t similar = 0;
    int16_t length = 0;
    __m256i vNegLimit;
    __m256i vPosLimit;
    __m256i vSaturationCheckMin;
    __m256i vSaturationCheckMax;
    __m256i vNegInfFront;
    __m256i vSegLenXgap;
    __m256i vSegLen;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile16.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 16; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    pvP  = (__m256i*)profile->profile16.score;
    pvPm = (__m256i*)profile->profile16.matches;
    pvPs = (__m256i*)profile->profile16.similar;
    vGapO = _mm256_set1_epi16(open);
    vGapE = _mm256_set1_epi16(gap);
    NEG_LIMIT = (-open < matrix->min ? INT16_MIN + open : INT16_MIN - matrix->min) + 1;
    POS_LIMIT = INT16_MAX - matrix->max - 1;
    vZero = _mm256_setzero_si256();
    vOne = _mm256_set1_epi16(1);
    score = NEG_LIMIT;
    matches = 0;
    similar = 0;
    length = 0;
    vNegLimit = _mm256_set1_epi16(NEG_LIMIT);
    vPosLimit = _mm256_set1_epi16(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInfFront = vZero;
    vSegLen = _mm256_slli_si256_rpl(_mm256_set1_epi16(segLen), 2);
    vNegInfFront = _mm256_insert_epi16_rpl(vNegInfFront, NEG_LIMIT, 0);
    vSegLenXgap = _mm256_adds_epi16(vNegInfFront,
            _mm256_slli_si256_rpl(_mm256_set1_epi16(-segLen*gap), 2));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(segLen*segWidth, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_SCAN
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_16 | PARASAIL_FLAG_LANES_16;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvE  = parasail_memalign___m256i(32, segLen);
    pvEM = parasail_memalign___m256i(32, segLen);
    pvES = parasail_memalign___m256i(32, segLen);
    pvEL = parasail_memalign___m256i(32, segLen);
    pvH  = parasail_memalign___m256i(32, segLen);
    pvHM = parasail_memalign___m256i(32, segLen);
    pvHS = parasail_memalign___m256i(32, segLen);
    pvHL = parasail_memalign___m256i(32, segLen);
    pvHMax  = parasail_memalign___m256i(32, segLen);
    pvHMMax = parasail_memalign___m256i(32, segLen);
    pvHSMax = parasail_memalign___m256i(32, segLen);
    pvHLMax = parasail_memalign___m256i(32, segLen);
    pvGapper = parasail_memalign___m256i(32, segLen);
    pvGapperL = parasail_memalign___m256i(32, segLen);
    boundary = parasail_memalign_int16_t(32, s2Len+1);

    /* validate heap variables */
    if (!pvE) return NULL;
    if (!pvEM) return NULL;
    if (!pvES) return NULL;
    if (!pvEL) return NULL;
    if (!pvH) return NULL;
    if (!pvHM) return NULL;
    if (!pvHS) return NULL;
    if (!pvHL) return NULL;
    if (!pvHMax) return NULL;
    if (!pvHMMax) return NULL;
    if (!pvHSMax) return NULL;
    if (!pvHLMax) return NULL;
    if (!pvGapper) return NULL;
    if (!pvGapperL) return NULL;
    if (!boundary) return NULL;

    parasail_memset___m256i(pvHM, vZero, segLen);
    parasail_memset___m256i(pvHS, vZero, segLen);
    parasail_memset___m256i(pvHL, vZero, segLen);
    parasail_memset___m256i(pvE, vNegLimit, segLen);
    parasail_memset___m256i(pvEM, vZero, segLen);
    parasail_memset___m256i(pvES, vZero, segLen);
    parasail_memset___m256i(pvEL, vZero, segLen);
    {
        __m256i vGapper = _mm256_subs_epi16(vZero,vGapO);
        __m256i vGapperL = vOne;
        for (i=segLen-1; i>=0; --i) {
            _mm256_store_si256(pvGapper+i, vGapper);
            _mm256_store_si256(pvGapperL+i, vGapperL);
            vGapper = _mm256_subs_epi16(vGapper, vGapE);
            vGapperL = _mm256_adds_epi16(vGapperL, vOne);
        }
    }

    /* initialize H */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m256i_16_t h;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = -open-gap*(segNum*segLen+i);
                h.v[segNum] = tmp < INT16_MIN ? INT16_MIN : tmp;
            }
            _mm256_store_si256(&pvH[index], h.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = -open-gap*(i-1);
            boundary[i] = tmp < INT16_MIN ? INT16_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m256i vE;
        __m256i vE_ext;
        __m256i vE_opn;
        __m256i vEM;
        __m256i vES;
        __m256i vEL;
        __m256i vHt;
        __m256i vHtM;
        __m256i vHtS;
        __m256i vHtL;
        __m256i vF;
        __m256i vF_ext;
        __m256i vF_opn;
        __m256i vFM;
        __m256i vFS;
        __m256i vFL;
        __m256i vH;
        __m256i vHM;
        __m256i vHS;
        __m256i vHL;
        __m256i vHp;
        __m256i vHpM;
        __m256i vHpS;
        __m256i vHpL;
        __m256i *pvW;
        __m256i vW;
        __m256i *pvWM;
        __m256i vWM;
        __m256i *pvWS;
        __m256i vWS;
        __m256i case1;
        __m256i case2;
        __m256i vGapper;
        __m256i vGapperL;

        /* calculate E */
        /* calculate Ht */
        /* calculate F and H first pass */
        vHp = _mm256_load_si256(pvH+(segLen-1));
        vHpM = _mm256_load_si256(pvHM+(segLen-1));
        vHpS = _mm256_load_si256(pvHS+(segLen-1));
        vHpL = _mm256_load_si256(pvHL+(segLen-1));
        vHp = _mm256_slli_si256_rpl(vHp, 2);
        vHpM = _mm256_slli_si256_rpl(vHpM, 2);
        vHpS = _mm256_slli_si256_rpl(vHpS, 2);
        vHpL = _mm256_slli_si256_rpl(vHpL, 2);
        vHp = _mm256_insert_epi16_rpl(vHp, boundary[j], 0);
        pvW = pvP + matrix->mapper[(unsigned char)s2[j]]*segLen;
        pvWM= pvPm+ matrix->mapper[(unsigned char)s2[j]]*segLen;
        pvWS= pvPs+ matrix->mapper[(unsigned char)s2[j]]*segLen;
        vHt = _mm256_subs_epi16(vNegLimit, pvGapper[0]);
        vF = vNegLimit;
        vFM = vZero;
        vFS = vZero;
        vFL = vZero;
        for (i=0; i<segLen; ++i) {
            vH = _mm256_load_si256(pvH+i);
            vHM= _mm256_load_si256(pvHM+i);
            vHS= _mm256_load_si256(pvHS+i);
            vHL= _mm256_load_si256(pvHL+i);
            vE = _mm256_load_si256(pvE+i);
            vEM= _mm256_load_si256(pvEM+i);
            vES= _mm256_load_si256(pvES+i);
            vEL= _mm256_load_si256(pvEL+i);
            vW = _mm256_load_si256(pvW+i);
            vWM = _mm256_load_si256(pvWM+i);
            vWS = _mm256_load_si256(pvWS+i);
            vGapper = _mm256_load_si256(pvGapper+i);
            vGapperL = _mm256_load_si256(pvGapperL+i);
            vE_opn = _mm256_subs_epi16(vH, vGapO);
            vE_ext = _mm256_subs_epi16(vE, vGapE);
            case1 = _mm256_cmpgt_epi16(vE_opn, vE_ext);
            vE = _mm256_max_epi16(vE_opn, vE_ext);
            vEM = _mm256_blendv_epi8(vEM, vHM, case1);
            vES = _mm256_blendv_epi8(vES, vHS, case1);
            vEL = _mm256_blendv_epi8(vEL, vHL, case1);
            vEL = _mm256_adds_epi16(vEL, vOne);
            vGapper = _mm256_adds_epi16(vHt, vGapper);
            case1 = _mm256_or_si256(
                    _mm256_cmpgt_epi16(vF, vGapper),
                    _mm256_cmpeq_epi16(vF, vGapper));
            vF = _mm256_max_epi16(vF, vGapper);
            vFM = _mm256_blendv_epi8(vHtM, vFM, case1);
            vFS = _mm256_blendv_epi8(vHtS, vFS, case1);
            vFL = _mm256_blendv_epi8(
                    _mm256_adds_epi16(vHtL, vGapperL),
                    vFL, case1);
            vHp = _mm256_adds_epi16(vHp, vW);
            vHpM = _mm256_adds_epi16(vHpM, vWM);
            vHpS = _mm256_adds_epi16(vHpS, vWS);
            vHpL = _mm256_adds_epi16(vHpL, vOne);
            case1 = _mm256_cmpgt_epi16(vE, vHp);
            vHt = _mm256_max_epi16(vE, vHp);
            vHtM = _mm256_blendv_epi8(vHpM, vEM, case1);
            vHtS = _mm256_blendv_epi8(vHpS, vES, case1);
            vHtL = _mm256_blendv_epi8(vHpL, vEL, case1);
            _mm256_store_si256(pvE+i, vE);
            _mm256_store_si256(pvEM+i, vEM);
            _mm256_store_si256(pvES+i, vES);
            _mm256_store_si256(pvEL+i, vEL);
            _mm256_store_si256(pvH+i, vHp);
            _mm256_store_si256(pvHM+i, vHpM);
            _mm256_store_si256(pvHS+i, vHpS);
            _mm256_store_si256(pvHL+i, vHpL);
            vHp = vH;
            vHpM = vHM;
            vHpS = vHS;
            vHpL = vHL;
        }

        /* pseudo prefix scan on F and H */
        vHt = _mm256_slli_si256_rpl(vHt, 2);
        vHtM = _mm256_slli_si256_rpl(vHtM, 2);
        vHtS = _mm256_slli_si256_rpl(vHtS, 2);
        vHtL = _mm256_slli_si256_rpl(vHtL, 2);
        vHt = _mm256_insert_epi16_rpl(vHt, boundary[j+1], 0);
        vGapper = _mm256_load_si256(pvGapper);
        vGapperL = _mm256_load_si256(pvGapperL);
        vGapper = _mm256_adds_epi16(vHt, vGapper);
        case1 = _mm256_or_si256(
                _mm256_cmpgt_epi16(vGapper, vF),
                _mm256_cmpeq_epi16(vGapper, vF));
        vF = _mm256_max_epi16(vF, vGapper);
        vFM = _mm256_blendv_epi8(vFM, vHtM, case1);
        vFS = _mm256_blendv_epi8(vFS, vHtS, case1);
        vFL = _mm256_blendv_epi8(
                vFL,
                _mm256_adds_epi16(vHtL, vGapperL),
                case1);
        for (i=0; i<segWidth-2; ++i) {
            __m256i vFt = _mm256_slli_si256_rpl(vF, 2);
            __m256i vFtM = _mm256_slli_si256_rpl(vFM, 2);
            __m256i vFtS = _mm256_slli_si256_rpl(vFS, 2);
            __m256i vFtL = _mm256_slli_si256_rpl(vFL, 2);
            vFt = _mm256_adds_epi16(vFt, vSegLenXgap);
            case1 = _mm256_or_si256(
                    _mm256_cmpgt_epi16(vFt, vF),
                    _mm256_cmpeq_epi16(vFt, vF));
            vF = _mm256_max_epi16(vF, vFt);
            vFM = _mm256_blendv_epi8(vFM, vFtM, case1);
            vFS = _mm256_blendv_epi8(vFS, vFtS, case1);
            vFL = _mm256_blendv_epi8(
                    vFL,
                    _mm256_adds_epi16(vFtL, vSegLen),
                    case1);
        }

        /* calculate final H */
        vF = _mm256_slli_si256_rpl(vF, 2);
        vFM = _mm256_slli_si256_rpl(vFM, 2);
        vFS = _mm256_slli_si256_rpl(vFS, 2);
        vFL = _mm256_slli_si256_rpl(vFL, 2);
        vF = _mm256_adds_epi16(vF, vNegInfFront);
        case1 = _mm256_cmpgt_epi16(vF, vHt);
        vH = _mm256_max_epi16(vF, vHt);
        vHM = _mm256_blendv_epi8(vHtM, vFM, case1);
        vHS = _mm256_blendv_epi8(vHtS, vFS, case1);
        vHL = _mm256_blendv_epi8(vHtL, vFL, case1);
        for (i=0; i<segLen; ++i) {
            vHp = _mm256_load_si256(pvH+i);
            vHpM = _mm256_load_si256(pvHM+i);
            vHpS = _mm256_load_si256(pvHS+i);
            vHpL = _mm256_load_si256(pvHL+i);
            vE = _mm256_load_si256(pvE+i);
            vEM = _mm256_load_si256(pvEM+i);
            vES = _mm256_load_si256(pvES+i);
            vEL = _mm256_load_si256(pvEL+i);
            vF_opn = _mm256_subs_epi16(vH, vGapO);
            vF_ext = _mm256_subs_epi16(vF, vGapE);
            vF = _mm256_max_epi16(vF_opn, vF_ext);
            case1 = _mm256_cmpgt_epi16(vF_opn, vF_ext);
            vFM = _mm256_blendv_epi8(vFM, vHM, case1);
            vFS = _mm256_blendv_epi8(vFS, vHS, case1);
            vFL = _mm256_blendv_epi8(vFL, vHL, case1);
            vFL = _mm256_adds_epi16(vFL, vOne);
            vH = _mm256_max_epi16(vHp, vE);
            vH = _mm256_max_epi16(vH, vF);
            case1 = _mm256_cmpeq_epi16(vH, vHp);
            case2 = _mm256_cmpeq_epi16(vH, vF);
            vHM = _mm256_blendv_epi8(
                    _mm256_blendv_epi8(vEM, vFM, case2),
                    vHpM, case1);
            vHS = _mm256_blendv_epi8(
                    _mm256_blendv_epi8(vES, vFS, case2),
                    vHpS, case1);
            vHL = _mm256_blendv_epi8(
                    _mm256_blendv_epi8(vEL, vFL, case2),
                    vHpL, case1);
            _mm256_store_si256(pvH+i, vH);
            _mm256_store_si256(pvHM+i, vHM);
            _mm256_store_si256(pvHS+i, vHS);
            _mm256_store_si256(pvHL+i, vHL);
            vSaturationCheckMin = _mm256_min_epi16(vSaturationCheckMin, vH);
            vSaturationCheckMax = _mm256_max_epi16(vSaturationCheckMax, vH);
            vSaturationCheckMax = _mm256_max_epi16(vSaturationCheckMax, vHM);
            vSaturationCheckMax = _mm256_max_epi16(vSaturationCheckMax, vHS);
            vSaturationCheckMax = _mm256_max_epi16(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
            arr_store_si256(result->stats->tables->score_table, vH, i, segLen, j, s2Len);
            arr_store_si256(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len);
            arr_store_si256(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len);
            arr_store_si256(result->stats->tables->length_table, vHL, i, segLen, j, s2Len);
#endif
        } 

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm256_load_si256(pvH + offset);
            vHM = _mm256_load_si256(pvHM + offset);
            vHS = _mm256_load_si256(pvHS + offset);
            vHL = _mm256_load_si256(pvHL + offset);
            for (k=0; k<position; ++k) {
                vH = _mm256_slli_si256_rpl(vH, 2);
                vHM = _mm256_slli_si256_rpl(vHM, 2);
                vHS = _mm256_slli_si256_rpl(vHS, 2);
                vHL = _mm256_slli_si256_rpl(vHL, 2);
            }
            result->stats->rowcols->score_row[j] = (int16_t) _mm256_extract_epi16_rpl (vH, 15);
            result->stats->rowcols->matches_row[j] = (int16_t) _mm256_extract_epi16_rpl (vHM, 15);
            result->stats->rowcols->similar_row[j] = (int16_t) _mm256_extract_epi16_rpl (vHS, 15);
            result->stats->rowcols->length_row[j] = (int16_t) _mm256_extract_epi16_rpl (vHL, 15);
        }
#endif
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m256i vH = _mm256_load_si256(pvH+i);
        __m256i vHM = _mm256_load_si256(pvHM+i);
        __m256i vHS = _mm256_load_si256(pvHS+i);
        __m256i vHL = _mm256_load_si256(pvHL+i);
        arr_store_col(result->stats->rowcols->score_col, vH, i, segLen);
        arr_store_col(result->stats->rowcols->matches_col, vHM, i, segLen);
        arr_store_col(result->stats->rowcols->similar_col, vHS, i, segLen);
        arr_store_col(result->stats->rowcols->length_col, vHL, i, segLen);
    }
#endif

    /* extract last value from the last column */
    {
        __m256i vH = _mm256_load_si256(pvH + offset);
        __m256i vHM = _mm256_load_si256(pvHM + offset);
        __m256i vHS = _mm256_load_si256(pvHS + offset);
        __m256i vHL = _mm256_load_si256(pvHL + offset);
        for (k=0; k<position; ++k) {
            vH = _mm256_slli_si256_rpl(vH, 2);
            vHM = _mm256_slli_si256_rpl(vHM, 2);
            vHS = _mm256_slli_si256_rpl(vHS, 2);
            vHL = _mm256_slli_si256_rpl(vHL, 2);
        }
        score = (int16_t) _mm256_extract_epi16_rpl (vH, 15);
        matches = (int16_t) _mm256_extract_epi16_rpl (vHM, 15);
        similar = (int16_t) _mm256_extract_epi16_rpl (vHS, 15);
        length = (int16_t) _mm256_extract_epi16_rpl (vHL, 15);
    }

    if (_mm256_movemask_epi8(_mm256_or_si256(
            _mm256_cmplt_epi16_rpl(vSaturationCheckMin, vNegLimit),
            _mm256_cmpgt_epi16(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        matches = 0;
        similar = 0;
        length = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;
    result->stats->matches = matches;
    result->stats->similar = similar;
    result->stats->length = length;

    parasail_free(boundary);
    parasail_free(pvGapperL);
    parasail_free(pvGapper);
    parasail_free(pvHLMax);
    parasail_free(pvHSMax);
    parasail_free(pvHMMax);
    parasail_free(pvHMax);
    parasail_free(pvHL);
    parasail_free(pvHS);
    parasail_free(pvHM);
    parasail_free(pvH);
    parasail_free(pvEL);
    parasail_free(pvES);
    parasail_free(pvEM);
    parasail_free(pvE);

    return result;
}